

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int comma2semicolon(char *string)

{
  int iVar1;
  char *local_20;
  char *tstr;
  char *string_local;
  
  local_20 = string;
  tstr = string;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if (*local_20 == '\0') {
            return 0;
          }
          if (*local_20 != ',') break;
          *local_20 = ';';
          local_20 = local_20 + 1;
        }
        if (*local_20 != '(') break;
        local_20 = local_20 + 1;
        iVar1 = find_paren(&local_20);
        if (iVar1 != 0) {
          return 1;
        }
      }
      if (*local_20 == '[') break;
      if (*local_20 == '{') {
        local_20 = local_20 + 1;
        iVar1 = find_curlybracket(&local_20);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else if (*local_20 == '\"') {
        local_20 = local_20 + 1;
        iVar1 = find_doublequote(&local_20);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else if (*local_20 == '\'') {
        local_20 = local_20 + 1;
        iVar1 = find_quote(&local_20);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        local_20 = local_20 + 1;
      }
    }
    local_20 = local_20 + 1;
    iVar1 = find_bracket(&local_20);
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int comma2semicolon(char *string)

/*  
    replace commas with semicolons, unless the comma is within a quoted or bracketed expression 
*/
{
    char *tstr;

    tstr = string;

    while (*tstr) {

        if (*tstr == ',') { /* found a comma */
           *tstr = ';';
           tstr++;
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(0);  /* reached end of string */
}